

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall Js::JavascriptLibrary::BeginDynamicFunctionReferences(JavascriptLibrary *this)

{
  Type pRVar1;
  Type TVar2;
  Recycler *alloc;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *ptr;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if ((this->dynamicFunctionReference).ptr ==
      (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)0x0) {
    local_50 = (undefined1  [8])&SList<Js::FunctionProxy*,Memory::Recycler,RealCount>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x1cc7;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    ptr = (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)
          new<Memory::Recycler>(0x18,alloc,0x37a1d4);
    pRVar1 = this->recycler;
    SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>::SListBase
              ((SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)ptr);
    ptr->allocator = pRVar1;
    Memory::WriteBarrierPtr<SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>_>::
    WriteBarrierSet(&this->dynamicFunctionReference,ptr);
    TVar2 = 1;
  }
  else {
    TVar2 = this->dynamicFunctionReferenceDepth + 1;
  }
  this->dynamicFunctionReferenceDepth = TVar2;
  return;
}

Assistant:

void JavascriptLibrary::BeginDynamicFunctionReferences()
    {
        if (this->dynamicFunctionReference == nullptr)
        {
            this->dynamicFunctionReference = RecyclerNew(this->recycler, FunctionReferenceList, this->recycler);
            this->dynamicFunctionReferenceDepth = 0;
        }

        this->dynamicFunctionReferenceDepth++;
    }